

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<unsigned_long> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  Arena **args_local;
  void *ptr_local;
  
  RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)ptr,*args);
  return (RepeatedField<unsigned_long> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }